

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dymon.cpp
# Opt level: O0

void log_status(int i,uint8_t *status,uint32_t count)

{
  ostream *poVar1;
  uint local_20;
  uint32_t j;
  uint32_t count_local;
  uint8_t *status_local;
  int i_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Status");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,i);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,count);
  std::operator<<(poVar1,"): ");
  for (local_20 = 0; local_20 < count; local_20 = local_20 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "0123456789ABCDEF"[(int)(uint)status[local_20] >> 4]);
    poVar1 = std::operator<<(poVar1,"0123456789ABCDEF"[(int)(status[local_20] & 0xf)]);
    std::operator<<(poVar1," ");
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void log_status(int i, const uint8_t * status, uint32_t count)
{
   static const char * const hex = "0123456789ABCDEF";
   std::cout << "Status" << i << " (" << count << "): ";
   for (uint32_t j = 0; j < count; ++j)
   {
      std::cout << hex[(status[j] >> 4)] << hex[(status[j] & 0xF)] << " ";
   }
   std::cout << std::endl;
}